

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

uint Js::JavascriptOperators::GetLiteralInlineSlotCapacity(PropertyIdArray *propIds)

{
  bool bVar1;
  ushort uVar2;
  uint uVar3;
  PropertyIndex slotCapacity;
  PropertyIndex slotCapacity_00;
  
  uVar3 = 0;
  if (propIds->hadDuplicates == false) {
    bVar1 = FunctionBody::DoObjectHeaderInliningForObjectLiteral(propIds);
    slotCapacity = (PropertyIndex)propIds->count;
    if (bVar1) {
      uVar2 = DynamicTypeHandler::RoundUpObjectHeaderInlinedInlineSlotCapacity(slotCapacity);
    }
    else {
      slotCapacity_00 = 0x10;
      if (propIds->count < 0x10) {
        slotCapacity_00 = slotCapacity;
      }
      uVar2 = DynamicTypeHandler::RoundUpInlineSlotCapacity(slotCapacity_00);
    }
    uVar3 = (uint)uVar2;
  }
  return uVar3;
}

Assistant:

uint JavascriptOperators::GetLiteralInlineSlotCapacity(
        Js::PropertyIdArray const * propIds)
    {
        if (propIds->hadDuplicates)
        {
            return 0;
        }

        return
            FunctionBody::DoObjectHeaderInliningForObjectLiteral(propIds)
                ?   DynamicTypeHandler::RoundUpObjectHeaderInlinedInlineSlotCapacity(static_cast<PropertyIndex>(propIds->count))
                :   DynamicTypeHandler::RoundUpInlineSlotCapacity(
                        static_cast<PropertyIndex>(
                            min(propIds->count, static_cast<uint32>(MaxPreInitializedObjectTypeInlineSlotCount))));
    }